

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlParsingData::Stamp
          (TiXmlParsingData *this,char *now,TiXmlEncoding encoding)

{
  uchar uVar1;
  uchar *puVar2;
  int local_3c;
  int step;
  uchar *pU;
  char *p;
  int local_20;
  int col;
  int row;
  TiXmlEncoding encoding_local;
  char *now_local;
  TiXmlParsingData *this_local;
  
  if (now == (char *)0x0) {
    __assert_fail("now",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0xc0,
                  "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                 );
  }
  if (0 < this->tabsize) {
    local_20 = (this->cursor).row;
    p._4_4_ = (this->cursor).col;
    puVar2 = (uchar *)this->stamp;
    if ((uchar *)this->stamp == (uchar *)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0xcb,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    while (pU = puVar2, pU < now) {
      uVar1 = *pU;
      if (uVar1 == '\0') {
        return;
      }
      if (uVar1 == '\t') {
        p._4_4_ = (p._4_4_ / this->tabsize + 1) * this->tabsize;
        puVar2 = pU + 1;
      }
      else if (uVar1 == '\n') {
        local_20 = local_20 + 1;
        p._4_4_ = 0;
        puVar2 = pU + 1;
        if (pU[1] == '\r') {
          puVar2 = pU + 2;
        }
      }
      else if (uVar1 == '\r') {
        local_20 = local_20 + 1;
        p._4_4_ = 0;
        puVar2 = pU + 1;
        if (pU[1] == '\n') {
          puVar2 = pU + 2;
        }
      }
      else if (uVar1 == 0xef) {
        if (encoding == TIXML_ENCODING_UTF8) {
          puVar2 = pU;
          if ((pU[1] != '\0') && (pU[2] != '\0')) {
            if ((((pU[1] != 0xbb) || (pU[2] != 0xbf)) && ((pU[1] != 0xbf || (pU[2] != 0xbe)))) &&
               ((pU[1] != 0xbf || (pU[2] != 0xbf)))) {
              p._4_4_ = p._4_4_ + 1;
            }
            pU = pU + 3;
            puVar2 = pU;
          }
        }
        else {
          p._4_4_ = p._4_4_ + 1;
          puVar2 = pU + 1;
        }
      }
      else {
        if (encoding == TIXML_ENCODING_UTF8) {
          local_3c = *(int *)(TiXmlBase::utf8ByteTable + (ulong)*pU * 4);
          if (local_3c == 0) {
            local_3c = 1;
          }
          pU = pU + local_3c;
        }
        else {
          pU = pU + 1;
        }
        p._4_4_ = p._4_4_ + 1;
        puVar2 = pU;
      }
    }
    (this->cursor).row = local_20;
    (this->cursor).col = p._4_4_;
    if ((this->cursor).row < -1) {
      __assert_fail("cursor.row >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x127,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    if ((this->cursor).col < -1) {
      __assert_fail("cursor.col >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x128,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    this->stamp = (char *)pU;
    if (this->stamp == (char *)0x0) {
      __assert_fail("stamp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x12a,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
  }
  return;
}

Assistant:

void TiXmlParsingData::Stamp(const char* now, TiXmlEncoding encoding) {
	assert(now);

	// Do nothing if the tabsize is 0.
	if (tabsize < 1) {
		return;
	}

	// Get the current row, column.
	int row = cursor.row;
	int col = cursor.col;
	const char* p = stamp;
	assert(p);

	while (p < now) {
		// Treat p as unsigned, so we have a happy compiler.
		const unsigned char* pU = (const unsigned char*) p;

		// Code contributed by Fletcher Dunn: (modified by lee)
		switch (*pU) {
		case 0:
			// We *should* never get here, but in case we do, don't
			// advance past the terminating null character, ever
			return;

		case '\r':
			// bump down to the next line
			++row;
			col = 0;
			// Eat the character
			++p;

			// Check for \r\n sequence, and treat this as a single character
			if (*p == '\n') {
				++p;
			}
			break;

		case '\n':
			// bump down to the next line
			++row;
			col = 0;

			// Eat the character
			++p;

			// Check for \n\r sequence, and treat this as a single
			// character.  (Yes, this bizarre thing does occur still
			// on some arcane platforms...)
			if (*p == '\r') {
				++p;
			}
			break;

		case '\t':
			// Eat the character
			++p;

			// Skip to next tab stop
			col = (col / tabsize + 1) * tabsize;
			break;

		case TIXML_UTF_LEAD_0:
			if (encoding == TIXML_ENCODING_UTF8) {
				if (*(p + 1) && *(p + 2)) {
					// In these cases, don't advance the column. These are
					// 0-width spaces.
					if (*(pU + 1) == TIXML_UTF_LEAD_1
						&& *(pU + 2) == TIXML_UTF_LEAD_2)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbeU)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbfU)
						p += 3;
					else {
						p += 3;
						++col;
					} // A normal character.
				}
			} else {
				++p;
				++col;
			}
			break;

		default:
			if (encoding == TIXML_ENCODING_UTF8) {
				// Eat the 1 to 4 byte utf8 character.
				int step = TiXmlBase::utf8ByteTable[*((const unsigned char*) p)];
				if (step == 0)
					step = 1; // Error case from bad encoding, but handle gracefully.
				p += step;

				// Just advance one column, of course.
				++col;
			} else {
				++p;
				++col;
			}
			break;
		}
	}
	cursor.row = row;
	cursor.col = col;
	assert(cursor.row >= -1);
	assert(cursor.col >= -1);
	stamp = p;
	assert(stamp);
}